

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.cpp
# Opt level: O2

void __thiscall sf2cute::RIFF::Write(RIFF *this,ostream *out)

{
  pointer puVar1;
  RIFFChunkInterface *pRVar2;
  size_type sVar3;
  unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_> *chunk;
  pointer puVar4;
  string local_40;
  
  std::ios::exceptions((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
  std::__cxx11::string::string((string *)&local_40,(string *)&this->name_);
  sVar3 = size(this);
  WriteHeader(out,&local_40,sVar3 - 8);
  std::__cxx11::string::~string((string *)&local_40);
  puVar1 = (this->chunks_).
           super__Vector_base<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->chunks_).
                super__Vector_base<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    pRVar2 = (puVar4->_M_t).
             super___uniq_ptr_impl<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_sf2cute::RIFFChunkInterface_*,_std::default_delete<sf2cute::RIFFChunkInterface>_>
             .super__Head_base<0UL,_sf2cute::RIFFChunkInterface_*,_false>._M_head_impl;
    (*pRVar2->_vptr_RIFFChunkInterface[4])(pRVar2,out);
  }
  return;
}

Assistant:

void RIFF::Write(std::ostream & out) const {
  // Save exception bits of output stream.
  const std::ios_base::iostate old_exception_bits = out.exceptions();
  // Set exception bits to get output error as an exception.
  out.exceptions(std::ios::badbit | std::ios::failbit);

  try {
    // Write the RIFF header.
    WriteHeader(out, name(), size() - 8);

    // Write each chunks.
    for (const auto & chunk : chunks_) {
      chunk->Write(out);
    }
  }
  catch (const std::exception &) {
    // Recover exception bits of output stream.
    out.exceptions(old_exception_bits);

    // Rethrow the exception.
    throw;
  }
}